

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

void apply_interval_value(rtr_socket *rtr_socket,uint32_t interval,rtr_interval_type type)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (type == RTR_INTERVAL_TYPE_RETRY) {
    rtr_socket->retry_interval = interval;
  }
  else if (type == RTR_INTERVAL_TYPE_REFRESH) {
    rtr_socket->refresh_interval = interval;
  }
  else if (type == RTR_INTERVAL_TYPE_EXPIRATION) {
    rtr_socket->expire_interval = interval;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void apply_interval_value(struct rtr_socket *rtr_socket, uint32_t interval, enum rtr_interval_type type)
{
	if (type == RTR_INTERVAL_TYPE_EXPIRATION)
		rtr_socket->expire_interval = interval;
	else if (type == RTR_INTERVAL_TYPE_REFRESH)
		rtr_socket->refresh_interval = interval;
	else if (type == RTR_INTERVAL_TYPE_RETRY)
		rtr_socket->retry_interval = interval;
}